

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int init_declarator(sym_t *s)

{
  int iVar1;
  node_t pvVar2;
  node_t left;
  
  iVar1 = declarator(s);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    if (t->id == 0x3d) {
      last_id = 0x3d;
      t = get_token();
      eline = t->line;
      ecolumn = t->column;
      pvVar2 = assignment_expression();
      if (pvVar2 == (node_t)0x0) {
        err(E,"expected expression after \'=\'");
      }
      else {
        left = identifier(s->id);
        pvVar2 = binop(0x3d,left,pvVar2);
        ast_add_node(pvVar2);
        if (s->function != 0) {
          err(E,"function \'%s\' declared like a variable",s);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int init_declarator(sym_t* s)
{
    if (declarator(s))
    {
        if (accept('='))
        {
            if (initializer(s))
            {
                if (s->function)
                    err(E, "function '%s' declared like a variable", s->id);
            }
            else
                err(E, "expected expression after '='");
        }
        return 1;
    }
    return 0;
}